

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O2

void __thiscall
HighsSimplexAnalysis::setupFactorTime(HighsSimplexAnalysis *this,HighsOptions *options)

{
  pointer pHVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  iterator __begin2;
  pointer factor_timer_clock;
  bool bVar5;
  FactorTimer factor_timer;
  value_type local_50;
  
  uVar2 = (options->super_HighsOptionsStruct).highs_analysis_level & 0x20;
  this->analyse_factor_time = SUB41(uVar2 >> 5,0);
  if (uVar2 == 0) {
    this->pointer_serial_factor_clocks = (HighsTimerClock *)0x0;
  }
  else {
    iVar3 = ::highs::parallel::num_threads();
    std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::clear
              (&this->thread_factor_clocks);
    iVar4 = 0;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      local_50.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_50.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_50.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_50.timer_pointer_ = this->timer_;
      std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::push_back
                (&this->thread_factor_clocks,&local_50);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&local_50.clock_.super__Vector_base<int,_std::allocator<int>_>);
    }
    factor_timer_clock =
         (this->thread_factor_clocks).
         super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
         super__Vector_impl_data._M_start;
    this->pointer_serial_factor_clocks = factor_timer_clock;
    pHVar1 = (this->thread_factor_clocks).
             super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (; factor_timer_clock != pHVar1; factor_timer_clock = factor_timer_clock + 1) {
      FactorTimer::initialiseFactorClocks((FactorTimer *)&local_50,factor_timer_clock);
    }
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::setupFactorTime(const HighsOptions& options) {
  analyse_factor_time =
      kHighsAnalysisLevelNlaTime & options.highs_analysis_level;
  if (analyse_factor_time) {
    // Set up the thread clocks
    HighsInt max_threads = highs::parallel::num_threads();
    thread_factor_clocks.clear();
    for (HighsInt i = 0; i < max_threads; i++) {
      HighsTimerClock clock;
      clock.timer_pointer_ = timer_;
      thread_factor_clocks.push_back(clock);
    }
    pointer_serial_factor_clocks = thread_factor_clocks.data();
    FactorTimer factor_timer;
    for (HighsTimerClock& clock : thread_factor_clocks)
      factor_timer.initialiseFactorClocks(clock);
  } else {
    pointer_serial_factor_clocks = NULL;
  }
}